

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O1

pair<_f0276eba_> __thiscall
cppcms::impl::details::basic_map<$7159f324$>::insert(basic_map<_7159f324_> *this,value_type *entry)

{
  container *pcVar1;
  range_type *r;
  iterator p;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  pair<_f0276eba_> pVar3;
  
  rehash_if_needed(this);
  r = basic_map<std::__cxx11::string,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>>>>
      ::get<std::__cxx11::string>
                ((basic_map<std::__cxx11::string,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>>>>
                  *)this,&entry->first);
  p = basic_map<std::__cxx11::string,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>>>>
      ::find_in_range<std::__cxx11::string>
                ((basic_map<std::__cxx11::string,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>>>>
                  *)this,r,&entry->first);
  if (p == (iterator)0x0) {
    p = allocate(this,entry);
    if (r->second == (container *)0x0) {
      p->next = (container *)0x0;
      pcVar1 = (this->list_).end;
      p->prev = pcVar1;
      if (pcVar1 != (container *)0x0) {
        pcVar1->next = p;
      }
      (this->list_).end = p;
      if ((this->list_).begin == (container *)0x0) {
        (this->list_).begin = p;
      }
      r->second = p;
      uVar2 = 0;
    }
    else {
      intrusive_list<$b487a5d2$>::insert_after(&this->list_,p,r->second);
      uVar2 = extraout_RDX;
      r = (range_type *)&r->second;
    }
    r->first = p;
    this->size_ = this->size_ + 1;
    uVar2 = CONCAT71((int7)((ulong)uVar2 >> 8),1);
  }
  else {
    uVar2 = 0;
  }
  pVar3._8_8_ = uVar2;
  pVar3.first = p;
  return pVar3;
}

Assistant:

std::pair<iterator,bool> insert(value_type const &entry)
	{
		std::pair<iterator,bool> r(iterator(),false);
		rehash_if_needed();
		range_type &range=get(entry.first);
		iterator p = find_in_range(range,entry.first);
		if(p) {
			r.first = p;
			return r;
		}
		p = allocate(entry);
		if(range.second == 0) {
			list_.push_back(p);
			range.first = range.second = p;
		}
		else {
			list_.insert_after(p,range.second);
			range.second = p;
		}

		r.first = p;
		r.second  = true;
		size_ ++;
		return r;
	}